

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_cast(lua_State *L)

{
  TValue *o;
  TValue *pTVar1;
  CTypeID CVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  CTState *cts;
  CType *pCVar6;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,(TValue *)0x0);
  pCVar6 = cts->tab;
  uVar5 = pCVar6[CVar2].info;
  pTVar1 = L->base;
  o = pTVar1 + 1;
  if (L->top <= o) {
    lj_err_arg(L,2,LJ_ERR_NOVAL);
  }
  L->top = pTVar1 + 2;
  if (((0xfffffff < uVar5) && (uVar5 = uVar5 >> 0x1c, uVar5 != 2)) && (uVar5 != 5)) {
    lj_err_arg(L,1,LJ_ERR_FFI_INVTYPE);
  }
  if ((*(int *)((long)pTVar1 + 0xc) != -0xb) || (CVar2 != *(ushort *)((ulong)(o->u32).lo + 6))) {
    pCVar6 = pCVar6 + CVar2;
    pvVar3 = lj_mem_newgco(cts->L,pCVar6->size + 8);
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(short *)((long)pvVar3 + 6) = (short)CVar2;
    lj_cconv_ct_tv(cts,pCVar6,(uint8_t *)((long)pvVar3 + 8),o,1);
    pTVar1[1].u32.lo = (uint32_t)pvVar3;
    *(undefined4 *)((long)pTVar1 + 0xc) = 0xfffffff5;
    uVar4 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar4 + 0x24) <= *(uint *)(uVar4 + 0x20)) {
      lj_gc_step(L);
    }
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_cast)	LJLIB_REC(ffi_new)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CType *d = ctype_raw(cts, id);
  TValue *o = lj_lib_checkany(L, 2);
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  if (!(ctype_isnum(d->info) || ctype_isptr(d->info) || ctype_isenum(d->info)))
    lj_err_arg(L, 1, LJ_ERR_FFI_INVTYPE);
  if (!(tviscdata(o) && cdataV(o)->ctypeid == id)) {
    GCcdata *cd = lj_cdata_new(cts, id, d->size);
    lj_cconv_ct_tv(cts, d, cdataptr(cd), o, CCF_CAST);
    setcdataV(L, o, cd);
    lj_gc_check(L);
  }
  return 1;
}